

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewind.cpp
# Opt level: O3

void anon_unknown.dwarf_99b2c::write_function
               (void *context,Pointer location,Pointer remapped_location,uint32_t value,
               int num_bytes,MemoryAccessType reason)

{
  uint32_t b;
  uint uVar1;
  Event *this;
  uint uVar2;
  
  this = snestistics::BlockVector<(anonymous_namespace)::Event,_174762>::last
                   ((BlockVector<(anonymous_namespace)::Event,_174762> *)(ulong)*context);
  if ((reason == RANDOM) || (reason == STACK_RELATIVE)) {
    if (this->data_pointer == 0xffffffff) {
      this->data_pointer = remapped_location;
      Event::set_data_size(this,num_bytes);
      uVar1 = this->_pc_bitset;
    }
    else {
      if (this->data_pointer != remapped_location) {
        __assert_fail("event.data_pointer == remapped_location",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/rewind.cpp"
                      ,0x2fa,
                      "void (anonymous namespace)::write_function(void *, Pointer, Pointer, uint32_t, int, MemoryAccessType)"
                     );
      }
      uVar1 = this->_pc_bitset;
      uVar2 = 1;
      if (((uVar1 >> 0x1c & 1) == 0) && (uVar2 = 2, (uVar1 >> 0x1d & 1) == 0)) {
        uVar2 = 3;
        if ((uVar1 >> 0x1e & 1) == 0) {
          uVar2 = uVar1 >> 0x1d;
        }
      }
      if (uVar2 != num_bytes) {
        __assert_fail("event.data_size() == num_bytes",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/rewind.cpp"
                      ,0x2fb,
                      "void (anonymous namespace)::write_function(void *, Pointer, Pointer, uint32_t, int, MemoryAccessType)"
                     );
      }
    }
    this->_pc_bitset = uVar1 | 0x8000000;
  }
  return;
}

Assistant:

void write_function(void* context, Pointer location, Pointer remapped_location, uint32_t value, int num_bytes, MemoryAccessType reason) {
	Event &event = ((State*)context)->events.last();
	if (reason == MemoryAccessType::RANDOM || reason == MemoryAccessType::STACK_RELATIVE) {
		if (event.data_pointer != INVALID_POINTER) {
			CUSTOM_ASSERT(event.data_pointer == remapped_location);
			CUSTOM_ASSERT(event.data_size() == num_bytes);
		} else {
			event.data_pointer = remapped_location;
			event.set_data_size(num_bytes);
		}
		event.set_bit(Event::BIT_HAD_WRITE_FLAG);
	}
}